

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# camera_info.cpp
# Opt level: O2

ostream * CMU462::Collada::operator<<(ostream *os,CameraInfo *camera)

{
  ostream *poVar1;
  
  poVar1 = std::operator<<(os,"CameraInfo: ");
  poVar1 = std::operator<<(poVar1,(string *)&(camera->super_Instance).name);
  poVar1 = std::operator<<(poVar1," (id: ");
  poVar1 = std::operator<<(poVar1,(string *)&(camera->super_Instance).id);
  poVar1 = std::operator<<(poVar1,")");
  poVar1 = std::operator<<(poVar1," [");
  poVar1 = std::operator<<(poVar1," hfov=");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,camera->hFov);
  poVar1 = std::operator<<(poVar1," vfov=");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,camera->vFov);
  poVar1 = std::operator<<(poVar1," nclip=");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,camera->nClip);
  poVar1 = std::operator<<(poVar1," fclip=");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,camera->fClip);
  poVar1 = std::operator<<(poVar1," ]");
  return poVar1;
}

Assistant:

std::ostream& operator<<(std::ostream& os, const CameraInfo& camera) {
  return os << "CameraInfo: " << camera.name << " (id: " << camera.id << ")"
            << " ["
            << " hfov=" << camera.hFov << " vfov=" << camera.vFov
            << " nclip=" << camera.nClip << " fclip=" << camera.fClip << " ]";
}